

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easy.c
# Opt level: O0

CURLcode easy_transfer(Curl_multi *multi)

{
  CURLMsg *pCVar1;
  CURLMsg *msg;
  long lStack_30;
  int rc;
  long sleep_ms;
  int local_20;
  CURLcode CStack_1c;
  _Bool gotsocket;
  int still_running;
  CURLcode result;
  CURLMcode mcode;
  _Bool done;
  Curl_multi *multi_local;
  
  result._3_1_ = CURLE_OK >> 0x18;
  still_running = 0;
  CStack_1c = CURLE_OK;
  _mcode = multi;
  while ((result._3_1_ & 1) == CURLE_OK >> 0x18 && still_running == 0) {
    local_20 = 0;
    sleep_ms._7_1_ = 0;
    still_running =
         Curl_multi_wait(_mcode,(curl_waitfd *)0x0,0,1000,(int *)0x0,(_Bool *)((long)&sleep_ms + 7))
    ;
    if (still_running == CURLM_OK) {
      if (((sleep_ms._7_1_ & 1) == 0) &&
         (curl_multi_timeout(_mcode,&stack0xffffffffffffffd0), lStack_30 != 0)) {
        if (1000 < lStack_30) {
          lStack_30 = 1000;
        }
        Curl_wait_ms((int)lStack_30);
      }
      still_running = curl_multi_perform(_mcode,&local_20);
    }
    if (((still_running == 0) && (local_20 == 0)) &&
       (pCVar1 = curl_multi_info_read(_mcode,(int *)((long)&msg + 4)), pCVar1 != (CURLMsg *)0x0)) {
      CStack_1c = (pCVar1->data).result;
      result._3_1_ = 1;
    }
  }
  if ((still_running != 0) && (CStack_1c = CURLE_BAD_FUNCTION_ARGUMENT, still_running == 3)) {
    CStack_1c = CURLE_OUT_OF_MEMORY;
  }
  return CStack_1c;
}

Assistant:

static CURLcode easy_transfer(struct Curl_multi *multi)
{
  bool done = FALSE;
  CURLMcode mcode = CURLM_OK;
  CURLcode result = CURLE_OK;

  while(!done && !mcode) {
    int still_running = 0;
    bool gotsocket = FALSE;

    mcode = Curl_multi_wait(multi, NULL, 0, 1000, NULL, &gotsocket);

    if(!mcode) {
      if(!gotsocket) {
        long sleep_ms;

        /* If it returns without any filedescriptor instantly, we need to
           avoid busy-looping during periods where it has nothing particular
           to wait for */
        curl_multi_timeout(multi, &sleep_ms);
        if(sleep_ms) {
          if(sleep_ms > 1000)
            sleep_ms = 1000;
          Curl_wait_ms((int)sleep_ms);
        }
      }

      mcode = curl_multi_perform(multi, &still_running);
    }

    /* only read 'still_running' if curl_multi_perform() return OK */
    if(!mcode && !still_running) {
      int rc;
      CURLMsg *msg = curl_multi_info_read(multi, &rc);
      if(msg) {
        result = msg->data.result;
        done = TRUE;
      }
    }
  }

  /* Make sure to return some kind of error if there was a multi problem */
  if(mcode) {
    result = (mcode == CURLM_OUT_OF_MEMORY) ? CURLE_OUT_OF_MEMORY :
              /* The other multi errors should never happen, so return
                 something suitably generic */
              CURLE_BAD_FUNCTION_ARGUMENT;
  }

  return result;
}